

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O2

RESOURCE_STATE Diligent::VkImageLayoutToResourceState(VkImageLayout Layout)

{
  RESOURCE_STATE RVar1;
  char (*in_R8) [2];
  VkImageLayout Layout_local;
  string msg;
  
  RVar1 = RESOURCE_STATE_UNDEFINED;
  Layout_local = Layout;
  switch(Layout) {
  case VK_IMAGE_LAYOUT_UNDEFINED:
    break;
  case VK_IMAGE_LAYOUT_GENERAL:
    RVar1 = RESOURCE_STATE_UNORDERED_ACCESS;
    break;
  case VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL:
    RVar1 = RESOURCE_STATE_RENDER_TARGET;
    break;
  case VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL:
    RVar1 = RESOURCE_STATE_DEPTH_WRITE;
    break;
  case VK_IMAGE_LAYOUT_DEPTH_STENCIL_READ_ONLY_OPTIMAL:
    RVar1 = RESOURCE_STATE_DEPTH_READ;
    break;
  case VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL:
    RVar1 = RESOURCE_STATE_SHADER_RESOURCE;
    break;
  case VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL:
    RVar1 = RESOURCE_STATE_COPY_SOURCE;
    break;
  case VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL:
    RVar1 = RESOURCE_STATE_COPY_DEST;
    break;
  case VK_IMAGE_LAYOUT_PREINITIALIZED:
    FormatString<char[29]>(&msg,(char (*) [29])"This layout is not supported");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VkImageLayoutToResourceState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x5d6);
    goto LAB_0025d113;
  default:
    if (Layout == VK_IMAGE_LAYOUT_PRESENT_SRC_KHR) {
      return RESOURCE_STATE_PRESENT;
    }
    if (Layout == VK_IMAGE_LAYOUT_SHARED_PRESENT_KHR) {
      FormatString<char[29]>(&msg,(char (*) [29])"This layout is not supported");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VkImageLayoutToResourceState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                 ,0x5da);
    }
    else if (Layout == VK_IMAGE_LAYOUT_DEPTH_READ_ONLY_STENCIL_ATTACHMENT_OPTIMAL) {
      FormatString<char[29]>(&msg,(char (*) [29])"This layout is not supported");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VkImageLayoutToResourceState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                 ,0x5d7);
    }
    else if (Layout == VK_IMAGE_LAYOUT_DEPTH_ATTACHMENT_STENCIL_READ_ONLY_OPTIMAL) {
      FormatString<char[29]>(&msg,(char (*) [29])"This layout is not supported");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VkImageLayoutToResourceState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                 ,0x5d8);
    }
    else {
      if ((Layout == VK_IMAGE_LAYOUT_FRAGMENT_SHADING_RATE_ATTACHMENT_OPTIMAL_KHR) ||
         (Layout == VK_IMAGE_LAYOUT_FRAGMENT_DENSITY_MAP_OPTIMAL_EXT)) {
        return RESOURCE_STATE_MAX_BIT;
      }
      FormatString<char[23],VkImageLayout,char[2]>
                (&msg,(Diligent *)"Unknown image layout (",(char (*) [23])&Layout_local,
                 (VkImageLayout *)0x647201,in_R8);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VkImageLayoutToResourceState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                 ,0x5df);
    }
LAB_0025d113:
    std::__cxx11::string::~string((string *)&msg);
  }
  return RVar1;
}

Assistant:

RESOURCE_STATE VkImageLayoutToResourceState(VkImageLayout Layout)
{
    static_assert(RESOURCE_STATE_MAX_BIT == (1u << 21), "This function must be updated to handle new resource state flag");
    switch (Layout)
    {
        // clang-format off
        case VK_IMAGE_LAYOUT_UNDEFINED:                                    return RESOURCE_STATE_UNDEFINED;
        case VK_IMAGE_LAYOUT_GENERAL:                                      return RESOURCE_STATE_UNORDERED_ACCESS;
        case VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL:                     return RESOURCE_STATE_RENDER_TARGET;
        case VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL:             return RESOURCE_STATE_DEPTH_WRITE;
        case VK_IMAGE_LAYOUT_DEPTH_STENCIL_READ_ONLY_OPTIMAL:              return RESOURCE_STATE_DEPTH_READ;
        case VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL:                     return RESOURCE_STATE_SHADER_RESOURCE;
        case VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL:                         return RESOURCE_STATE_COPY_SOURCE;
        case VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL:                         return RESOURCE_STATE_COPY_DEST;
        case VK_IMAGE_LAYOUT_PREINITIALIZED:                               UNEXPECTED("This layout is not supported"); return RESOURCE_STATE_UNDEFINED;
        case VK_IMAGE_LAYOUT_DEPTH_READ_ONLY_STENCIL_ATTACHMENT_OPTIMAL:   UNEXPECTED("This layout is not supported"); return RESOURCE_STATE_UNDEFINED;
        case VK_IMAGE_LAYOUT_DEPTH_ATTACHMENT_STENCIL_READ_ONLY_OPTIMAL:   UNEXPECTED("This layout is not supported"); return RESOURCE_STATE_UNDEFINED;
        case VK_IMAGE_LAYOUT_PRESENT_SRC_KHR:                              return RESOURCE_STATE_PRESENT;
        case VK_IMAGE_LAYOUT_SHARED_PRESENT_KHR:                           UNEXPECTED("This layout is not supported"); return RESOURCE_STATE_UNDEFINED;
        case VK_IMAGE_LAYOUT_FRAGMENT_DENSITY_MAP_OPTIMAL_EXT:
        case VK_IMAGE_LAYOUT_FRAGMENT_SHADING_RATE_ATTACHMENT_OPTIMAL_KHR: return RESOURCE_STATE_SHADING_RATE;
        // clang-format on
        default:
            UNEXPECTED("Unknown image layout (", Layout, ")");
            return RESOURCE_STATE_UNDEFINED;
    }
}